

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

QHash<int,_QTextObjectHandler> * __thiscall
QHash<int,_QTextObjectHandler>::operator=
          (QHash<int,_QTextObjectHandler> *this,QHash<int,_QTextObjectHandler> *other)

{
  Data *pDVar1;
  Data *pDVar2;
  Data<QHashPrivate::Node<int,_QTextObjectHandler>_> *this_00;
  Data *o;
  
  pDVar1 = other->d;
  if (this->d != pDVar1) {
    if ((pDVar1 != (Data *)0x0) && (*(int *)pDVar1 != -1)) {
      LOCK();
      *(int *)pDVar1 = *(int *)pDVar1 + 1;
      UNLOCK();
    }
    pDVar2 = this->d;
    if ((pDVar2 != (Data *)0x0) && (*(int *)pDVar2 != -1)) {
      LOCK();
      *(int *)pDVar2 = *(int *)pDVar2 + -1;
      UNLOCK();
      if ((*(int *)pDVar2 == 0) &&
         (this_00 = this->d, this_00 != (Data<QHashPrivate::Node<int,_QTextObjectHandler>_> *)0x0))
      {
        QHashPrivate::Data<QHashPrivate::Node<int,_QTextObjectHandler>_>::~Data(this_00);
        operator_delete(this_00,0x28);
      }
    }
    this->d = pDVar1;
  }
  return this;
}

Assistant:

QHash &operator=(const QHash &other) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (d != other.d) {
            Data *o = other.d;
            if (o)
                o->ref.ref();
            if (d && !d->ref.deref())
                delete d;
            d = o;
        }
        return *this;
    }